

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Light.cpp
# Opt level: O1

Photon * __thiscall Light::emitPhoton(Photon *__return_storage_ptr__,Light *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  Vector3 P;
  double local_48;
  double dStack_40;
  double local_38;
  Vector3 local_30;
  
  iVar2 = rand();
  iVar3 = rand();
  getPos(&local_30,this,1.0 - ((double)iVar2 + (double)iVar2) / 2147483647.0,
         1.0 - ((double)iVar3 + (double)iVar3) / 2147483647.0);
  (__return_storage_ptr__->flux).x = 0.0;
  (__return_storage_ptr__->flux).y = 0.0;
  (__return_storage_ptr__->flux).z = 0.0;
  Ray::Ray(&__return_storage_ptr__->ray);
  (__return_storage_ptr__->ray).O.z = local_30.z;
  (__return_storage_ptr__->ray).O.x = local_30.x;
  (__return_storage_ptr__->ray).O.y = local_30.y;
  dVar1 = (this->color).y;
  (__return_storage_ptr__->flux).x = (this->color).x;
  (__return_storage_ptr__->flux).y = dVar1;
  (__return_storage_ptr__->flux).z = (this->color).z;
  Vector3::randomVector();
  (__return_storage_ptr__->ray).V.z = local_38;
  (__return_storage_ptr__->ray).V.x = local_48;
  (__return_storage_ptr__->ray).V.y = dStack_40;
  return __return_storage_ptr__;
}

Assistant:

Photon Light::emitPhoton() const
{
    double x = 1 - rand() * 2. / RAND_MAX;
    double y = 1 - rand() * 2. / RAND_MAX;
    Vector3 P = getPos(x, y);
    Photon photon;
    photon.ray.O = P;
    photon.flux = color;// / color.power();
    //return photon.diffused(P, Dx.cross(Dy).normalized()* (rand() % 2 ? 1 : -1));
    photon.ray.V = Vector3::randomVector();
    return photon;
}